

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

int utf8cmp(void *src1,void *src2)

{
  byte bVar1;
  byte bVar2;
  uchar *s2;
  uchar *s1;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    bVar1 = *(byte *)((long)src1 + lVar3);
    bVar2 = *(byte *)((long)src2 + lVar3);
    if (bVar1 == 0 && bVar2 == 0) {
      return 0;
    }
    if (bVar1 < bVar2) break;
    if (bVar1 >= bVar2 && bVar1 != bVar2) {
      return 1;
    }
    lVar3 = lVar3 + 1;
  }
  return -1;
}

Assistant:

int utf8cmp(const void *src1, const void *src2) {
  const unsigned char *s1 = (const unsigned char *)src1;
  const unsigned char *s2 = (const unsigned char *)src2;

  while (('\0' != *s1) || ('\0' != *s2)) {
    if (*s1 < *s2) {
      return -1;
    } else if (*s1 > *s2) {
      return 1;
    }

    s1++;
    s2++;
  }

  // both utf8 strings matched
  return 0;
}